

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test7::buildTestProgram(GPUShaderFP64Test7 *this,_variables *variables)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLint GVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  ostream *this_00;
  undefined8 uVar10;
  string local_d48 [32];
  char *local_d28;
  MessageBuilder local_d20;
  string local_ba0 [32];
  stringstream local_b80 [8];
  stringstream attribute_name_sstream;
  ostream local_b70;
  reference local_9f8;
  _variable *current_variable;
  size_t n_variable;
  size_t n_variables;
  MessageBuilder local_860;
  MessageBuilder local_6e0;
  MessageBuilder local_560;
  MessageBuilder local_3e0;
  MessageBuilder local_260;
  int local_e0;
  byte local_d9;
  GLint link_status;
  bool result;
  string vs_body;
  string te_body;
  string tc_body;
  string gs_body;
  Functions *gl;
  string fs_body;
  _variables *variables_local;
  GPUShaderFP64Test7 *this_local;
  long lVar7;
  
  fs_body.field_2._8_8_ = variables;
  getFragmentShaderBody_abi_cxx11_((string *)&gl,this,variables);
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  getGeometryShaderBody_abi_cxx11_
            ((string *)((long)&tc_body.field_2 + 8),this,(_variables *)fs_body.field_2._8_8_);
  getTessellationControlShaderBody_abi_cxx11_
            ((string *)((long)&te_body.field_2 + 8),this,(_variables *)fs_body.field_2._8_8_);
  getTessellationEvaluationShaderBody_abi_cxx11_
            ((string *)((long)&vs_body.field_2 + 8),this,(_variables *)fs_body.field_2._8_8_);
  getVertexShaderBody_abi_cxx11_((string *)&link_status,this,(_variables *)fs_body.field_2._8_8_);
  local_d9 = 0;
  local_e0 = 0;
  bVar2 = compileShader(this,this->m_fs_id,(string *)&gl);
  if (bVar2) {
    bVar2 = compileShader(this,this->m_gs_id,(string *)((long)&tc_body.field_2 + 8));
    if (bVar2) {
      bVar2 = compileShader(this,this->m_tc_id,(string *)((long)&te_body.field_2 + 8));
      if (bVar2) {
        bVar2 = compileShader(this,this->m_te_id,(string *)((long)&vs_body.field_2 + 8));
        if (bVar2) {
          bVar2 = compileShader(this,this->m_vs_id,(string *)&link_status);
          if (bVar2) {
            releaseXFBVaryingNames(this);
            generateXFBVaryingNames(this,(_variables *)fs_body.field_2._8_8_);
            (**(code **)(lVar7 + 0x14c8))
                      (this->m_po_id,this->m_n_xfb_varyings,this->m_xfb_varyings,0x8c8c);
            (**(code **)(lVar7 + 0xce8))(this->m_po_id);
            dVar4 = (**(code **)(lVar7 + 0x800))();
            glu::checkError(dVar4,
                            "Either glTransformFeedbackVaryings() or glLinkProgram() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x22f1);
            (**(code **)(lVar7 + 0x9d8))(this->m_po_id,0x8b82,&local_e0);
            dVar4 = (**(code **)(lVar7 + 0x800))();
            glu::checkError(dVar4,"glGetProgramiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x22f4);
            if (local_e0 == 1) {
              if ((this->m_are_double_inputs_supported & 1U) != 0) {
                n_variable = std::
                             vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                             ::size((vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                                     *)fs_body.field_2._8_8_);
                for (current_variable = (_variable *)0x0; current_variable < n_variable;
                    current_variable =
                         (_variable *)((long)&current_variable->attribute_location + 1)) {
                  local_9f8 = std::
                              vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                              ::operator[]((vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                                            *)fs_body.field_2._8_8_,(size_type)current_variable);
                  std::__cxx11::stringstream::stringstream(local_b80);
                  this_00 = std::operator<<(&local_b70,"in_vs_variable");
                  std::ostream::operator<<(this_00,(ulong)current_variable);
                  if (1 < local_9f8->array_size) {
                    std::operator<<(&local_b70,"[0]");
                  }
                  pcVar1 = *(code **)(lVar7 + 0x780);
                  GVar5 = this->m_po_id;
                  std::__cxx11::stringstream::str();
                  uVar10 = std::__cxx11::string::c_str();
                  GVar5 = (*pcVar1)(GVar5,uVar10);
                  local_9f8->attribute_location = GVar5;
                  std::__cxx11::string::~string(local_ba0);
                  bVar2 = local_9f8->attribute_location == -1;
                  if (bVar2) {
                    pTVar8 = tcu::TestContext::getLog
                                       ((this->super_TestCase).super_TestCase.super_TestNode.
                                        m_testCtx);
                    tcu::TestLog::operator<<
                              (&local_d20,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
                    pMVar9 = tcu::MessageBuilder::operator<<
                                       (&local_d20,
                                        (char (*) [41])"Input double-precision attribute named [");
                    std::__cxx11::stringstream::str();
                    local_d28 = (char *)std::__cxx11::string::c_str();
                    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_d28);
                    pMVar9 = tcu::MessageBuilder::operator<<
                                       (pMVar9,(char (*) [43])
                                               "] is considered inactive which is invalid.");
                    tcu::MessageBuilder::operator<<
                              (pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::string::~string(local_d48);
                    tcu::MessageBuilder::~MessageBuilder(&local_d20);
                    this->m_has_test_passed = false;
                  }
                  std::__cxx11::stringstream::~stringstream(local_b80);
                  if (bVar2) {
                    if (!bVar2) goto LAB_00fb1725;
                    goto LAB_00fb1710;
                  }
                }
              }
              std::__cxx11::string::operator=((string *)&this->m_current_fs_body,(string *)&gl);
              std::__cxx11::string::operator=
                        ((string *)&this->m_current_gs_body,
                         (string *)(tc_body.field_2._M_local_buf + 8));
              std::__cxx11::string::operator=
                        ((string *)&this->m_current_tc_body,
                         (string *)(te_body.field_2._M_local_buf + 8));
              std::__cxx11::string::operator=
                        ((string *)&this->m_current_te_body,
                         (string *)(vs_body.field_2._M_local_buf + 8));
              std::__cxx11::string::operator=
                        ((string *)&this->m_current_vs_body,(string *)&link_status);
              local_d9 = 1;
            }
            else {
              pTVar8 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        ((MessageBuilder *)&n_variables,pTVar8,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar9 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)&n_variables,
                                  (char (*) [39])"A valid program object failed to link.");
              tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&n_variables);
            }
          }
          else {
            pTVar8 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_860,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar9 = tcu::MessageBuilder::operator<<
                               (&local_860,(char (*) [33])"Vertex shader failed to compile.");
            tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_860);
          }
        }
        else {
          pTVar8 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_6e0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_6e0,
                              (char (*) [50])"Tessellation evaluation shader failed to compile.");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_6e0);
        }
      }
      else {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_560,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_560,
                            (char (*) [47])"Tessellation control shader failed to compile.");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_560);
      }
    }
    else {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3e0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_3e0,(char (*) [35])"Geometry shader failed to compile.");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3e0);
    }
  }
  else {
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_260,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_260,(char (*) [35])"Fragment shader failed to compile.");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_260);
  }
LAB_00fb1710:
  this_local._7_1_ = local_d9 & 1;
LAB_00fb1725:
  std::__cxx11::string::~string((string *)&link_status);
  std::__cxx11::string::~string((string *)(vs_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(te_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(tc_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&gl);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GPUShaderFP64Test7::buildTestProgram(_variables& variables)
{
	std::string			  fs_body = getFragmentShaderBody(variables);
	const glw::Functions& gl	  = m_context.getRenderContext().getFunctions();
	std::string			  gs_body = getGeometryShaderBody(variables);
	std::string			  tc_body = getTessellationControlShaderBody(variables);
	std::string			  te_body = getTessellationEvaluationShaderBody(variables);
	std::string			  vs_body = getVertexShaderBody(variables);
	bool				  result  = false;

	/* Try to link the program object */
	glw::GLint link_status = GL_FALSE;

	/* Compile the shaders */
	if (!compileShader(m_fs_id, fs_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Fragment shader failed to compile." << tcu::TestLog::EndMessage;

		goto end;
	}

	if (!compileShader(m_gs_id, gs_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Geometry shader failed to compile." << tcu::TestLog::EndMessage;

		goto end;
	}

	if (!compileShader(m_tc_id, tc_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation control shader failed to compile."
						   << tcu::TestLog::EndMessage;

		goto end;
	}

	if (!compileShader(m_te_id, te_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation evaluation shader failed to compile."
						   << tcu::TestLog::EndMessage;

		goto end;
	}

	if (!compileShader(m_vs_id, vs_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex shader failed to compile." << tcu::TestLog::EndMessage;

		goto end;
	}

	/* Configure XFB */
	releaseXFBVaryingNames();
	generateXFBVaryingNames(variables);

	gl.transformFeedbackVaryings(m_po_id, m_n_xfb_varyings, m_xfb_varyings, GL_INTERLEAVED_ATTRIBS);

	gl.linkProgram(m_po_id);

	/* Have we succeeded? */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Either glTransformFeedbackVaryings() or glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "A valid program object failed to link."
						   << tcu::TestLog::EndMessage;

		goto end;
	}

	/* Retrieve attribute locations *if* GL_ARB_vertex_attrib_64bit is supported */
	if (m_are_double_inputs_supported)
	{
		const size_t n_variables = variables.size();

		for (size_t n_variable = 0; n_variable < n_variables; ++n_variable)
		{
			_variable&		  current_variable = variables[n_variable];
			std::stringstream attribute_name_sstream;

			attribute_name_sstream << "in_vs_variable" << n_variable;

			if (current_variable.array_size > 1)
			{
				attribute_name_sstream << "[0]";
			}

			current_variable.attribute_location = gl.getAttribLocation(m_po_id, attribute_name_sstream.str().c_str());

			if (current_variable.attribute_location == -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Input double-precision attribute named ["
								   << attribute_name_sstream.str().c_str()
								   << "] is considered inactive which is invalid." << tcu::TestLog::EndMessage;

				m_has_test_passed = false;
				goto end;
			}
		} /* for (all test variables) */
	}	 /* if (m_are_double_inputs_supported) */

	m_current_fs_body = fs_body;
	m_current_gs_body = gs_body;
	m_current_tc_body = tc_body;
	m_current_te_body = te_body;
	m_current_vs_body = vs_body;

	result = true;

end:
	return result;
}